

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<char16_t>::setCapacity(Vector<char16_t> *this,size_t newSize)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  RemoveConst<char16_t> *pRVar3;
  ulong __n;
  ArrayBuilder<char16_t> local_38;
  
  pcVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pcVar1 >> 1)) {
    (this->builder).pos = pcVar1 + newSize;
  }
  local_38.pos = (RemoveConst<char16_t> *)
                 _::HeapArrayDisposer::allocateImpl
                           (2,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar1 = (this->builder).ptr;
  pcVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (pcVar1 != pcVar2) {
    __n = (long)pcVar2 - (long)pcVar1 & 0xfffffffffffffffe;
    memcpy(local_38.pos,pcVar1,__n);
    local_38.pos = (RemoveConst<char16_t> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<char16_t>::operator=(&this->builder,&local_38);
  pcVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pcVar1 = local_38.ptr;
  if (local_38.ptr != (char16_t *)0x0) {
    local_38.ptr = (char16_t *)0x0;
    local_38.pos = (RemoveConst<char16_t> *)0x0;
    local_38.endPtr = (char16_t *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pcVar1,2,(long)pRVar3 - (long)pcVar1 >> 1,
               (long)pcVar2 - (long)pcVar1 >> 1,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }